

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.cc
# Opt level: O2

Symbol * __thiscall
sentencepiece::bpe::Trainer::GetPairSymbol(Trainer *this,Symbol *left,Symbol *right)

{
  pointer puVar1;
  bool bVar2;
  iterator iVar3;
  char *pcVar4;
  ostream *poVar5;
  _Rb_tree_header *p_Var6;
  Symbol *pSVar7;
  pointer puVar8;
  Symbol *s;
  UnicodeText ut;
  uint64 fp;
  
  if (((right == (Symbol *)0x0 || left == (Symbol *)0x0) || (left->is_unk != false)) ||
     (right->is_unk != false)) {
    pSVar7 = (Symbol *)0x0;
  }
  else {
    fp = port::FingerprintCat
                   ((uint64)ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,(uint64)s);
    iVar3 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_std::allocator<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->symbols_cache_)._M_h,&fp);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
        ._M_cur == (__node_type *)0x0) {
      if ((left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,1);
        pcVar4 = logging::BaseName("src/bpe_model_trainer.cc");
        poVar5 = std::operator<<((ostream *)&std::cerr,pcVar4);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x40);
        poVar5 = std::operator<<(poVar5,") [");
        poVar5 = std::operator<<(poVar5,"!left->chars.empty()");
        std::operator<<(poVar5,"] ");
        error::Die::~Die((Die *)&ut);
      }
      if ((right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,1);
        pcVar4 = logging::BaseName("src/bpe_model_trainer.cc");
        poVar5 = std::operator<<((ostream *)&std::cerr,pcVar4);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x41);
        poVar5 = std::operator<<(poVar5,") [");
        poVar5 = std::operator<<(poVar5,"!right->chars.empty()");
        std::operator<<(poVar5,"] ");
        error::Die::~Die((Die *)&ut);
      }
      ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar1 = (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (puVar8 = (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
      {
        s = (Symbol *)CONCAT44(s._4_4_,*puVar8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&ut,(value_type_conflict *)&s);
      }
      puVar1 = (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (puVar8 = (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
      {
        s = (Symbol *)CONCAT44(s._4_4_,*puVar8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&ut,(value_type_conflict *)&s);
      }
      bVar2 = TrainerInterface::IsValidSentencePiece(&this->super_TrainerInterface,&ut);
      if (bVar2) {
        s = (Symbol *)operator_new(0x70);
        (s->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (s->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var6 = &(s->positions)._M_t._M_impl.super__Rb_tree_header;
        s->left = (Symbol *)0x0;
        s->right = (Symbol *)0x0;
        (s->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (s->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(s->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(s->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1) = 0;
        s->fp = 0;
        s->freq = 0;
        (s->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
        (s->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
        (s->positions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::
        vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
        ::push_back(&this->allocated_,&s);
        s->fp = fp;
        s->left = left;
        s->right = right;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&s->chars,&ut);
        port::
        InsertOrDie<std::unordered_map<unsigned_long,sentencepiece::bpe::Trainer::Symbol*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,sentencepiece::bpe::Trainer::Symbol*>>>>
                  (&this->symbols_cache_,&s->fp,&s);
        pSVar7 = s;
      }
      else {
        pSVar7 = (Symbol *)0x0;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    else {
      pSVar7 = *(Symbol **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
                       ._M_cur + 0x10);
    }
  }
  return pSVar7;
}

Assistant:

Trainer::Symbol *Trainer::GetPairSymbol(const Symbol *left,
                                        const Symbol *right) {
  if (left == nullptr || right == nullptr || left->is_unk || right->is_unk) {
    return nullptr;
  }

  const uint64 fp = port::FingerprintCat(left->fp, right->fp);
  const auto it = symbols_cache_.find(fp);
  if (it != symbols_cache_.end()) {
    return it->second;
  }

  CHECK(!left->chars.empty());
  CHECK(!right->chars.empty());
  string_util::UnicodeText ut;
  for (const char32 c : left->chars) ut.push_back(c);
  for (const char32 c : right->chars) ut.push_back(c);

  // Do not make an invalid piece.
  if (!IsValidSentencePiece(ut)) {
    return nullptr;
  }

  Symbol *s = new Symbol;
  allocated_.push_back(s);
  s->fp = fp;
  s->left = left;
  s->right = right;
  s->chars = ut;
  port::InsertOrDie(&symbols_cache_, s->fp, s);
  return s;
}